

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

void Cloud_CacheAllocate(CloudManager *dd,CloudOper oper,int logratio)

{
  int logratio_local;
  CloudOper oper_local;
  CloudManager *dd_local;
  
  if (logratio < 1) {
    __assert_fail("logratio > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                  ,0xc5,"void Cloud_CacheAllocate(CloudManager *, CloudOper, int)");
  }
  if (logratio < dd->bitsNode) {
    if (logratio != 0) {
      dd->bitsCache[oper] = dd->bitsNode - logratio;
      dd->shiftCache[oper] = 0x20 - dd->bitsCache[oper];
    }
    cloudCacheAllocate(dd,oper);
    return;
  }
  __assert_fail("logratio < dd->bitsNode",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                ,0xc6,"void Cloud_CacheAllocate(CloudManager *, CloudOper, int)");
}

Assistant:

void Cloud_CacheAllocate( CloudManager * dd, CloudOper oper, int logratio )
{
	assert( logratio > 0 );            // cache cannot be larger than the unique table 
	assert( logratio < dd->bitsNode ); // cache cannot be smaller than 2 entries

	if ( logratio )
	{
		dd->bitsCache[oper]  = dd->bitsNode - logratio;
		dd->shiftCache[oper] = 8*sizeof(unsigned) - dd->bitsCache[oper];
	}
	cloudCacheAllocate( dd, oper );
}